

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O0

char * foreach_value_variable(char *name,char *item)

{
  long local_38;
  size_t i;
  int diff;
  char *rv;
  char *item_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (item == (char *)0x0)) {
    name_local = (char *)0x0;
  }
  else {
    name_local = bc_strdup_printf("%s__%s",name,item);
    for (local_38 = 0; name_local[local_38] != '\0'; local_38 = local_38 + 1) {
      if (((name_local[local_38] < '0') || ('9' < name_local[local_38])) &&
         ((name_local[local_38] < 'A' || ('Z' < name_local[local_38])))) {
        if ((name_local[local_38] < 'a') || ('z' < name_local[local_38])) {
          name_local[local_38] = '_';
        }
        else {
          name_local[local_38] = name_local[local_38] + -0x20;
        }
      }
    }
  }
  return name_local;
}

Assistant:

static char*
foreach_value_variable(const char *name, const char *item)
{
    if (name == NULL || item == NULL)
        return NULL;

    char *rv = bc_strdup_printf("%s__%s", name, item);
    int diff = 'a' - 'A';  // just to avoid magic numbers
    for (size_t i = 0; rv[i] != '\0'; i++) {
        if ((rv[i] >= '0' && rv[i] <= '9') ||
            (rv[i] >= 'A' && rv[i] <= 'Z')) {
            continue;
        }
        if (rv[i] >= 'a' && rv[i] <= 'z') {
            rv[i] -= diff;
            continue;
        }
        rv[i] = '_';
    }

    return rv;
}